

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

bool __thiscall IR::Opnd::IsArgumentsObject(Opnd *this)

{
  bool bVar1;
  StackSym *pSVar2;
  
  pSVar2 = GetStackSym(this);
  if ((pSVar2 != (StackSym *)0x0) &&
     (((pSVar2->field_5).m_instrDef != (Instr *)0x0 & pSVar2->field_0x18) == 1)) {
    bVar1 = Instr::HasAnyLoadHeapArgsOpCode((pSVar2->field_5).m_instrDef);
    return bVar1;
  }
  return false;
}

Assistant:

bool
Opnd::IsArgumentsObject()
{
    // returns "false" if the sym is not single def (happens when the parent function has formals); the opnd can still be the arguments object.
    // Since we need this information in the inliner where we don't track arguments object sym, going with single def is the best option.
    StackSym * sym = this->GetStackSym();

    return sym && sym->IsSingleDef() && sym->GetInstrDef()->HasAnyLoadHeapArgsOpCode();
}